

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void renameTableFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3 *db;
  sqlite3_xauth p_Var1;
  FKey *pFVar2;
  Trigger *pTVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  RenameToken *pToken;
  char *pcVar7;
  char *pcVar8;
  char *zName;
  char *pcVar9;
  i64 iVar10;
  RenameToken *pRVar11;
  RenameToken *pRVar12;
  RenameToken *pRVar13;
  RenameToken **ppRVar14;
  TriggerStep *pTVar15;
  uint uVar16;
  bool bVar17;
  RenameCtx sCtx;
  Walker sWalker;
  Parse sParse;
  NameContext sNC;
  RenameToken *local_298;
  RenameCtx local_288;
  char *local_260;
  Trigger *local_258;
  char *local_250;
  char *local_248;
  sqlite3_value **local_240;
  Walker local_238;
  Parse local_208;
  NameContext local_68;
  
  db = context->pOut->db;
  pcVar7 = (char *)sqlite3ValueText(*argv,'\x01');
  pcVar8 = (char *)sqlite3ValueText(argv[3],'\x01');
  zName = (char *)sqlite3ValueText(argv[4],'\x01');
  pcVar9 = (char *)sqlite3ValueText(argv[5],'\x01');
  local_240 = argv;
  iVar10 = sqlite3VdbeIntValue(argv[6]);
  if (pcVar9 != (char *)0x0 && (zName != (char *)0x0 && pcVar8 != (char *)0x0)) {
    p_Var1 = db->xAuth;
    db->xAuth = (sqlite3_xauth)0x0;
    local_250 = pcVar8;
    local_248 = pcVar9;
    if (db->noSharedCache == '\0') {
      btreeEnterAll(db);
    }
    local_288.pTab = (Table *)0x0;
    local_288.zOld = (char *)0x0;
    local_288.pList = (RenameToken *)0x0;
    local_288.nList = 0;
    local_288.iCol = 0;
    local_288.pTab = sqlite3FindTable(db,zName,pcVar7);
    local_238.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
    local_238.walkerDepth = 0;
    local_238.eCode = '\0';
    local_238._37_3_ = 0;
    local_238.xExprCallback = renameTableExprCb;
    local_238.xSelectCallback = renameTableSelectCb;
    local_238.pParse = &local_208;
    local_238.u.pNC = (NameContext *)&local_288;
    iVar4 = renameParseSql(&local_208,pcVar7,1,db,local_250,(int)iVar10);
    if (iVar4 == 0) {
      uVar16 = (uint)db->flags;
      local_260 = zName;
      if (local_208.pNewTable == (Table *)0x0) {
        if (local_208.pNewIndex == (Index *)0x0) {
          local_258 = local_208.pNewTrigger;
          pcVar8 = (local_208.pNewTrigger)->table;
          if (((pcVar8 != (char *)0x0) && (iVar4 = sqlite3StrICmp(pcVar8,zName), iVar4 == 0)) &&
             (local_208.pRename != (RenameToken *)0x0 &&
              (local_288.pTab)->pSchema == local_258->pTabSchema)) {
            pRVar13 = local_208.pRename;
            if ((char *)(local_208.pRename)->p == pcVar8) {
              ppRVar14 = &local_208.pRename;
            }
            else {
              do {
                pRVar12 = pRVar13;
                pRVar13 = pRVar12->pNext;
                if (pRVar13 == (RenameToken *)0x0) goto LAB_0019d046;
              } while ((char *)pRVar13->p != pcVar8);
              ppRVar14 = &pRVar12->pNext;
            }
            *ppRVar14 = pRVar13->pNext;
            pRVar13->pNext = local_288.pList;
            local_288.nList = local_288.nList + 1;
            local_288.pList = pRVar13;
          }
LAB_0019d046:
          iVar4 = 0;
          if ((uVar16 >> 0x1a & 1) == 0) {
            if ((int)iVar10 != 0) {
              pcVar7 = (char *)0x0;
            }
            iVar4 = renameResolveTrigger(&local_208,pcVar7);
            pTVar3 = local_258;
            if (iVar4 == 0) {
              renameWalkTrigger(&local_238,local_258);
              pTVar15 = pTVar3->step_list;
              iVar4 = 0;
              if (pTVar15 != (TriggerStep *)0x0) {
                local_298 = local_288.pList;
                iVar5 = local_288.nList;
                do {
                  pcVar7 = pTVar15->zTarget;
                  if ((pcVar7 != (char *)0x0) &&
                     (iVar4 = sqlite3StrICmp(pcVar7,local_260),
                     local_208.pRename != (RenameToken *)0x0 && iVar4 == 0)) {
                    pRVar13 = local_208.pRename;
                    ppRVar14 = &local_208.pRename;
                    if ((char *)(local_208.pRename)->p != pcVar7) {
                      do {
                        pRVar12 = pRVar13;
                        pRVar13 = pRVar12->pNext;
                        if (pRVar13 == (RenameToken *)0x0) goto LAB_0019d117;
                      } while ((char *)pRVar13->p != pcVar7);
                      ppRVar14 = &pRVar12->pNext;
                    }
                    *ppRVar14 = pRVar13->pNext;
                    pRVar13->pNext = local_298;
                    iVar5 = iVar5 + 1;
                    local_288.nList = iVar5;
                    local_298 = pRVar13;
                    local_288.pList = pRVar13;
                  }
LAB_0019d117:
                  pTVar15 = pTVar15->pNext;
                  iVar4 = 0;
                } while (pTVar15 != (TriggerStep *)0x0);
              }
            }
          }
        }
        else {
          if (local_208.pRename != (RenameToken *)0x0) {
            if ((char *)(local_208.pRename)->p == (local_208.pNewIndex)->zName) {
              ppRVar14 = &local_208.pRename;
              pRVar13 = local_208.pRename;
            }
            else {
              do {
                pRVar13 = local_208.pRename;
                local_208.pRename = pRVar13->pNext;
                if (local_208.pRename == (RenameToken *)0x0) goto LAB_0019cfcd;
              } while ((char *)(local_208.pRename)->p != (local_208.pNewIndex)->zName);
              ppRVar14 = &pRVar13->pNext;
              pRVar13 = local_208.pRename;
            }
            *ppRVar14 = pRVar13->pNext;
            pRVar13->pNext = local_288.pList;
            local_288.nList = local_288.nList + 1;
            local_288.pList = pRVar13;
          }
LAB_0019cfcd:
          iVar4 = 0;
          if (((uVar16 >> 0x1a & 1) == 0) && ((local_208.pNewIndex)->pPartIdxWhere != (Expr *)0x0))
          {
            walkExpr(&local_238,(local_208.pNewIndex)->pPartIdxWhere);
          }
        }
      }
      else if ((local_208.pNewTable)->pSelect == (Select *)0x0) {
        if (((byte)(db->flags >> 0x1a) & 0x3f & (uVar16 >> 0xe & 1) == 0) == 0) {
          pRVar13 = local_288.pList;
          iVar4 = local_288.nList;
          for (pFVar2 = (local_208.pNewTable)->pFKey; pFVar2 != (FKey *)0x0;
              pFVar2 = pFVar2->pNextFrom) {
            pcVar7 = pFVar2->zTo;
            if (pcVar7 == (char *)0x0) {
              bVar17 = true;
            }
            else {
              iVar5 = sqlite3StrICmp(pcVar7,local_260);
              bVar17 = iVar5 != 0;
            }
            if (!(bool)(local_208.pRename == (RenameToken *)0x0 | bVar17)) {
              ppRVar14 = &local_208.pRename;
              pRVar12 = local_208.pRename;
              if ((char *)(local_208.pRename)->p != pcVar7) {
                do {
                  pRVar11 = pRVar12;
                  pRVar12 = pRVar11->pNext;
                  if (pRVar12 == (RenameToken *)0x0) goto LAB_0019ce80;
                } while ((char *)pRVar12->p != pcVar7);
                ppRVar14 = &pRVar11->pNext;
              }
              *ppRVar14 = pRVar12->pNext;
              pRVar12->pNext = pRVar13;
              iVar4 = iVar4 + 1;
              local_288.nList = iVar4;
              pRVar13 = pRVar12;
              local_288.pList = pRVar12;
            }
LAB_0019ce80:
          }
        }
        iVar5 = 0;
        iVar4 = 0;
        if (((local_208.pNewTable)->zName != (char *)0x0) &&
           (iVar6 = sqlite3StrICmp(local_260,(local_208.pNewTable)->zName), iVar4 = iVar5,
           iVar6 == 0)) {
          local_288.pTab = local_208.pNewTable;
          if ((uVar16 >> 0x1a & 1) == 0) {
            sqlite3WalkExprList(&local_238,(local_208.pNewTable)->pCheck);
          }
          if (local_208.pRename != (RenameToken *)0x0) {
            if ((char *)(local_208.pRename)->p == (local_208.pNewTable)->zName) {
              ppRVar14 = &local_208.pRename;
              pRVar13 = local_208.pRename;
            }
            else {
              do {
                pRVar13 = local_208.pRename;
                local_208.pRename = pRVar13->pNext;
                if (local_208.pRename == (RenameToken *)0x0) goto LAB_0019cc37;
              } while ((char *)(local_208.pRename)->p != (local_208.pNewTable)->zName);
              ppRVar14 = &pRVar13->pNext;
              pRVar13 = local_208.pRename;
            }
            *ppRVar14 = pRVar13->pNext;
            pRVar13->pNext = local_288.pList;
            local_288.nList = local_288.nList + 1;
            local_288.pList = pRVar13;
          }
        }
      }
      else if ((uVar16 >> 0x1a & 1) == 0) {
        local_68.pSrcList = (SrcList *)0x0;
        local_68.nRef = 0;
        local_68.nErr = 0;
        local_68.ncFlags = 0;
        local_68._42_6_ = 0;
        local_68.uNC.pEList = (ExprList *)0x0;
        local_68.pNext = (NameContext *)0x0;
        local_68.pWinSelect = (Select *)0x0;
        local_68.pParse = &local_208;
        sqlite3SelectPrep(&local_208,(local_208.pNewTable)->pSelect,&local_68);
        if (local_208.nErr != 0) {
          local_208.nErr = local_208.rc;
        }
        sqlite3WalkSelect(&local_238,(local_208.pNewTable)->pSelect);
        iVar4 = local_208.nErr;
      }
      else {
        iVar4 = 0;
      }
    }
LAB_0019cc37:
    if (iVar4 == 0) {
      iVar4 = renameEditSql(context,&local_288,local_250,local_248,1);
    }
    if (iVar4 != 0) {
      if (local_208.zErrMsg == (char *)0x0) {
        sqlite3_result_error_code(context,iVar4);
      }
      else {
        renameColumnParseError(context,0,local_240[1],local_240[2],&local_208);
      }
    }
    renameParseCleanup(&local_208);
    pRVar13 = local_288.pList;
    while (pRVar13 != (RenameToken *)0x0) {
      pRVar12 = pRVar13->pNext;
      sqlite3DbFreeNN(db,pRVar13);
      pRVar13 = pRVar12;
    }
    if (db->noSharedCache == '\0') {
      btreeLeaveAll(db);
    }
    db->xAuth = p_Var1;
  }
  return;
}

Assistant:

static void renameTableFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zDb = (const char*)sqlite3_value_text(argv[0]);
  const char *zInput = (const char*)sqlite3_value_text(argv[3]);
  const char *zOld = (const char*)sqlite3_value_text(argv[4]);
  const char *zNew = (const char*)sqlite3_value_text(argv[5]);
  int bTemp = sqlite3_value_int(argv[6]);
  UNUSED_PARAMETER(NotUsed);

  if( zInput && zOld && zNew ){
    Parse sParse;
    int rc;
    int bQuote = 1;
    RenameCtx sCtx;
    Walker sWalker;

#ifndef SQLITE_OMIT_AUTHORIZATION
    sqlite3_xauth xAuth = db->xAuth;
    db->xAuth = 0;
#endif

    sqlite3BtreeEnterAll(db);

    memset(&sCtx, 0, sizeof(RenameCtx));
    sCtx.pTab = sqlite3FindTable(db, zOld, zDb);
    memset(&sWalker, 0, sizeof(Walker));
    sWalker.pParse = &sParse;
    sWalker.xExprCallback = renameTableExprCb;
    sWalker.xSelectCallback = renameTableSelectCb;
    sWalker.u.pRename = &sCtx;

    rc = renameParseSql(&sParse, zDb, 1, db, zInput, bTemp);

    if( rc==SQLITE_OK ){
      int isLegacy = (db->flags & SQLITE_LegacyAlter);
      if( sParse.pNewTable ){
        Table *pTab = sParse.pNewTable;

        if( pTab->pSelect ){
          if( isLegacy==0 ){
            NameContext sNC;
            memset(&sNC, 0, sizeof(sNC));
            sNC.pParse = &sParse;

            sqlite3SelectPrep(&sParse, pTab->pSelect, &sNC);
            if( sParse.nErr ) rc = sParse.rc;
            sqlite3WalkSelect(&sWalker, pTab->pSelect);
          }
        }else{
          /* Modify any FK definitions to point to the new table. */
#ifndef SQLITE_OMIT_FOREIGN_KEY
          if( isLegacy==0 || (db->flags & SQLITE_ForeignKeys) ){
            FKey *pFKey;
            for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
              if( sqlite3_stricmp(pFKey->zTo, zOld)==0 ){
                renameTokenFind(&sParse, &sCtx, (void*)pFKey->zTo);
              }
            }
          }
#endif

          /* If this is the table being altered, fix any table refs in CHECK
          ** expressions. Also update the name that appears right after the
          ** "CREATE [VIRTUAL] TABLE" bit. */
          if( sqlite3_stricmp(zOld, pTab->zName)==0 ){
            sCtx.pTab = pTab;
            if( isLegacy==0 ){
              sqlite3WalkExprList(&sWalker, pTab->pCheck);
            }
            renameTokenFind(&sParse, &sCtx, pTab->zName);
          }
        }
      }

      else if( sParse.pNewIndex ){
        renameTokenFind(&sParse, &sCtx, sParse.pNewIndex->zName);
        if( isLegacy==0 ){
          sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
        }
      }

#ifndef SQLITE_OMIT_TRIGGER
      else{
        Trigger *pTrigger = sParse.pNewTrigger;
        TriggerStep *pStep;
        if( 0==sqlite3_stricmp(sParse.pNewTrigger->table, zOld) 
            && sCtx.pTab->pSchema==pTrigger->pTabSchema
          ){
          renameTokenFind(&sParse, &sCtx, sParse.pNewTrigger->table);
        }

        if( isLegacy==0 ){
          rc = renameResolveTrigger(&sParse, bTemp ? 0 : zDb);
          if( rc==SQLITE_OK ){
            renameWalkTrigger(&sWalker, pTrigger);
            for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
              if( pStep->zTarget && 0==sqlite3_stricmp(pStep->zTarget, zOld) ){
                renameTokenFind(&sParse, &sCtx, pStep->zTarget);
              }
            }
          }
        }
      }
#endif
    }

    if( rc==SQLITE_OK ){
      rc = renameEditSql(context, &sCtx, zInput, zNew, bQuote);
    }
    if( rc!=SQLITE_OK ){
      if( sParse.zErrMsg ){
        renameColumnParseError(context, 0, argv[1], argv[2], &sParse);
      }else{
        sqlite3_result_error_code(context, rc);
      }
    }

    renameParseCleanup(&sParse);
    renameTokenFree(db, sCtx.pList);
    sqlite3BtreeLeaveAll(db);
#ifndef SQLITE_OMIT_AUTHORIZATION
    db->xAuth = xAuth;
#endif
  }

  return;
}